

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

void __thiscall HEkkDualRow::setupSlice(HEkkDualRow *this,HighsInt size)

{
  HEkk *pHVar1;
  
  this->workSize = size;
  pHVar1 = this->ekk_instance_;
  this->workMove =
       (pHVar1->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  this->workDual =
       (pHVar1->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->workRange =
       (pHVar1->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->work_devex_index =
       (pHVar1->info_).devex_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->packCount = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->packIndex,(long)size);
  std::vector<double,_std::allocator<double>_>::resize(&this->packValue,(long)this->workSize);
  this->workCount = 0;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::resize
            (&this->workData,(long)this->workSize);
  this->analysis = &this->ekk_instance_->analysis_;
  return;
}

Assistant:

void HEkkDualRow::setupSlice(HighsInt size) {
  workSize = size;
  workMove = ekk_instance_.basis_.nonbasicMove_.data();
  workDual = ekk_instance_.info_.workDual_.data();
  workRange = ekk_instance_.info_.workRange_.data();
  work_devex_index = ekk_instance_.info_.devex_index_.data();

  // Allocate spaces
  packCount = 0;
  packIndex.resize(workSize);
  packValue.resize(workSize);

  workCount = 0;
  workData.resize(workSize);
  analysis = &ekk_instance_.analysis_;
}